

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall Buffer_copyout_some_Test::TestBody(Buffer_copyout_some_Test *this)

{
  int iVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  string allstrs;
  size_t n_got;
  size_type n_expected;
  size_t n_pages;
  size_t n_writable;
  size_t n_readable;
  BufferWithReadonlyStrings local;
  array<char,_128UL> array;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  AssertHelper local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  AssertHelper local_1a8;
  long *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  long local_190 [2];
  size_t local_180;
  unsigned_long local_178;
  size_t local_170;
  size_t local_168;
  size_t local_160;
  BufferWithReadonlyStrings local_158;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_158);
  local_160 = bfy_buffer_get_content_len(&local_158.buf);
  local_168 = bfy_buffer_get_space_len(&local_158.buf);
  local_170 = bfy_buffer_peek(&local_158.buf,0xffffffffffffffff,(bfy_iovec *)0x0,0);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_178 = 0x1b;
  local_180 = bfy_buffer_copyout(&local_158.buf,0x1b,&local_98);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_1a0,"n_expected","n_got",&local_178,&local_180);
  if (local_1a0._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_198->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x30e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_198 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_198,local_198);
  }
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_158.allstrs._M_dataplus._M_p,
             local_158.allstrs._M_dataplus._M_p + local_158.allstrs._M_string_length);
  if (local_180 != 0) {
    iVar1 = bcmp(&local_98,local_1a0,local_180);
    local_1d8.data_._0_1_ = iVar1 == 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 != 0) {
      testing::Message::Message((Message *)&local_1e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)&local_1d8,
                 (AssertionResult *)
                 "std::equal(std::data(array), std::data(array)+n_got, std::data(allstrs))","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
                 ,0x310,(char *)CONCAT71(local_1c8._1_7_,local_1c8[0]));
      testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != &local_1b8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_1c8._1_7_,local_1c8[0]),
                        local_1b8._M_allocated_capacity + 1);
      }
      if (local_1e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
      if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,local_1d0);
      }
    }
  }
  local_1d8.data_ = (AssertHelperData *)bfy_buffer_get_content_len(&local_158.buf);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1c8,"n_readable","bfy_buffer_get_content_len(&local.buf)",&local_160,
             (unsigned_long *)&local_1d8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x313,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1d8.data_ + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_1d8.data_ = (AssertHelperData *)bfy_buffer_get_space_len(&local_158.buf);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1c8,"n_writable","bfy_buffer_get_space_len(&local.buf)",&local_168,
             (unsigned_long *)&local_1d8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x314,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1d8.data_ + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_1d8.data_ =
       (AssertHelperData *)bfy_buffer_peek(&local_158.buf,0xffffffffffffffff,(bfy_iovec *)0x0,0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1c8,"n_pages","buffer_count_pages(&local.buf)",&local_170,
             (unsigned_long *)&local_1d8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x315,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    if (local_1d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1d8.data_ + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  if (local_1a0 != local_190) {
    operator_delete(local_1a0,local_190[0] + 1);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_158);
  return;
}

Assistant:

TEST(Buffer, copyout_some) {
    auto local = BufferWithReadonlyStrings {};
    auto const n_readable = bfy_buffer_get_content_len(&local.buf);
    auto const n_writable = bfy_buffer_get_space_len(&local.buf);
    auto const n_pages = buffer_count_pages(&local.buf);

    // copy out some of it
    auto array = std::array<char, 128>{};
    auto constexpr n_expected = std::size(str1) + 1;
    auto const n_got = bfy_buffer_copyout(&local.buf, n_expected, std::data(array));

    // confirm we got what we expected
    EXPECT_EQ(n_expected, n_got);
    auto const allstrs = local.allstrs;
    EXPECT_TRUE(std::equal(std::data(array), std::data(array)+n_got, std::data(allstrs)));

    // confirm that buffer is unchanged
    EXPECT_EQ(n_readable, bfy_buffer_get_content_len(&local.buf));
    EXPECT_EQ(n_writable, bfy_buffer_get_space_len(&local.buf));
    EXPECT_EQ(n_pages, buffer_count_pages(&local.buf));
}